

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-link.h
# Opt level: O1

void __thiscall
mp::pre::Many2ManyLink::PostsolveGenericInt
          (Many2ManyLink *this,LinkIndexRange ir,ValueResolution vr)

{
  _Elt_pointer ppVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  pair<mp::pre::NodeRange,_mp::pre::NodeRange> *ppVar6;
  ulong uVar7;
  int iVar8;
  
  if (ir.end_ != ir.beg_) {
    iVar8 = ir.beg_ - ir.end_;
    lVar4 = ((long)ir >> 0x20) << 5;
    uVar2 = (long)ir >> 0x20;
    do {
      uVar7 = uVar2 - 1;
      if (vr == ValResAll) {
LAB_001737f5:
        ppVar1 = (this->entries_).
                 super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar3 = (long)ppVar1 -
                (long)(this->entries_).
                      super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 5;
        uVar2 = lVar3 + uVar7;
        if (uVar2 < 0x10) {
          ppVar6 = (pair<mp::pre::NodeRange,_mp::pre::NodeRange> *)
                   ((long)&ppVar1[-1].first.pvn_ + lVar4);
        }
        else {
          uVar5 = (uVar2 >> 4) + 0xf000000000000000;
          if (0 < (long)uVar2) {
            uVar5 = uVar2 >> 4;
          }
          ppVar6 = (this->entries_).
                   super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] +
                   lVar3 + uVar5 * -0x10 + uVar7;
        }
        Collect<int>(this,ppVar6->first,ppVar6->second,vr);
      }
      else {
        uVar2 = uVar2 + 0x3e;
        if (-1 < (long)uVar7) {
          uVar2 = uVar7;
        }
        if (((this->if_consider_for_last_link_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [((long)uVar2 >> 6) +
              (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (uVar7 & 0x3f) & 1) != 0) goto LAB_001737f5;
      }
      iVar8 = iVar8 + 1;
      lVar4 = lVar4 + -0x20;
      uVar2 = uVar7;
    } while (iVar8 != 0);
  }
  return;
}

Assistant:

LIST_PRESOLVE_METHODS

protected:
  /// Distribute values of type T from nr1 to nr2
  template <class T>
  void Distr(NodeRange nr1, NodeRange nr2, ValueResolution vr) {
    auto ir1 = nr1.GetIndexRange();
    auto ir2 = nr2.GetIndexRange();
    for (auto i0=ir1.beg_; i0!=ir1.end_; ++i0) {
      // Need reference here for reference counting
      // in PresolveNames():
      const auto& val = nr1.GetValueNode()->
          GetVal<T>(i0);
      if (ValueResolution::ValResAll == vr) {
        for (auto i=ir2.beg_; i!=ir2.end_; ++i)
          nr2.GetValueNode()->SetVal(i, val);
      } else {
        assert(ValueResolution::ValResLast == vr);
        nr2.GetValueNode()->SetVal(ir2.end_ - 1, val);
      }
    }